

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadSamplerProperties(ColladaParser *this,Sampler *out)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  Logger *this_00;
  undefined4 extraout_var_08;
  Assimp *pAVar5;
  undefined8 in_RCX;
  char *pcVar6;
  ai_real aVar7;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar3 == '\0') {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    cVar1 = (char)iVar3;
    while (cVar1 != '\0') {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar3 == 1) {
        if (iVar4 != 1) {
LAB_0041eb00:
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"wrapU");
        if (iVar3 == 0) {
          bVar2 = ReadBoolFromTextContent(this);
          out->mWrapU = bVar2;
          pcVar6 = "wrapU";
        }
        else {
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar3 != 1) goto LAB_0041eb00;
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),"wrapV");
          if (iVar3 == 0) {
            bVar2 = ReadBoolFromTextContent(this);
            out->mWrapV = bVar2;
            pcVar6 = "wrapV";
          }
          else {
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar3 != 1) goto LAB_0041eb00;
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar3 = strcmp((char *)CONCAT44(extraout_var_01,iVar3),"mirrorU");
            pcVar6 = "mirrorV";
            if (iVar3 == 0) {
              bVar2 = ReadBoolFromTextContent(this);
              out->mMirrorU = bVar2;
              pcVar6 = "mirrorU";
            }
            else {
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
              if (iVar3 != 1) goto LAB_0041eb00;
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar3 = strcmp((char *)CONCAT44(extraout_var_02,iVar3),"mirrorV");
              if (iVar3 == 0) {
                bVar2 = ReadBoolFromTextContent(this);
                out->mMirrorV = bVar2;
              }
              else {
                iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                if (iVar3 != 1) goto LAB_0041eb00;
                iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                pcVar6 = "repeatU";
                iVar3 = strcmp((char *)CONCAT44(extraout_var_03,iVar3),"repeatU");
                if (iVar3 == 0) {
                  pAVar5 = (Assimp *)GetTextContent(this);
                  uStack_38 = uStack_38 & 0xffffffff;
                  fast_atoreal_move<float>
                            (pAVar5,(char *)((long)&uStack_38 + 4),(float *)0x1,SUB81(in_RCX,0));
                  (out->mTransform).mScaling.x = uStack_38._4_4_;
                }
                else {
                  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                  if (iVar3 != 1) goto LAB_0041eb00;
                  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                  pcVar6 = "repeatV";
                  iVar3 = strcmp((char *)CONCAT44(extraout_var_04,iVar3),"repeatV");
                  if (iVar3 == 0) {
                    pAVar5 = (Assimp *)GetTextContent(this);
                    uStack_38 = uStack_38 & 0xffffffff;
                    fast_atoreal_move<float>
                              (pAVar5,(char *)((long)&uStack_38 + 4),(float *)0x1,SUB81(in_RCX,0));
                    (out->mTransform).mScaling.y = uStack_38._4_4_;
                  }
                  else {
                    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                    if (iVar3 != 1) goto LAB_0041eb00;
                    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                    pcVar6 = "offsetU";
                    iVar3 = strcmp((char *)CONCAT44(extraout_var_05,iVar3),"offsetU");
                    if (iVar3 == 0) {
                      pAVar5 = (Assimp *)GetTextContent(this);
                      uStack_38 = uStack_38 & 0xffffffff;
                      fast_atoreal_move<float>
                                (pAVar5,(char *)((long)&uStack_38 + 4),(float *)0x1,SUB81(in_RCX,0))
                      ;
                      (out->mTransform).mTranslation.x = uStack_38._4_4_;
                    }
                    else {
                      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                      if (iVar3 != 1) goto LAB_0041eb00;
                      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                      pcVar6 = "offsetV";
                      iVar3 = strcmp((char *)CONCAT44(extraout_var_06,iVar3),"offsetV");
                      if (iVar3 == 0) {
                        pAVar5 = (Assimp *)GetTextContent(this);
                        uStack_38 = uStack_38 & 0xffffffff;
                        fast_atoreal_move<float>
                                  (pAVar5,(char *)((long)&uStack_38 + 4),(float *)0x1,
                                   SUB81(in_RCX,0));
                        (out->mTransform).mTranslation.y = uStack_38._4_4_;
                      }
                      else {
                        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                        if (iVar3 != 1) goto LAB_0041eb00;
                        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                        pcVar6 = "rotateUV";
                        iVar3 = strcmp((char *)CONCAT44(extraout_var_07,iVar3),"rotateUV");
                        if (iVar3 == 0) {
                          aVar7 = ReadFloatFromTextContent(this);
                          (out->mTransform).mRotation = aVar7;
                        }
                        else {
                          bVar2 = IsElement(this,"blend_mode");
                          if (bVar2) {
                            pcVar6 = GetTextContent(this);
                            iVar3 = ASSIMP_strincmp(pcVar6,"ADD",3);
                            if (iVar3 == 0) {
                              out->mOp = aiTextureOp_Add;
                            }
                            else {
                              iVar3 = ASSIMP_strincmp(pcVar6,"SUBTRACT",8);
                              if (iVar3 == 0) {
                                out->mOp = aiTextureOp_Subtract;
                              }
                              else {
                                iVar3 = ASSIMP_strincmp(pcVar6,"MULTIPLY",8);
                                if (iVar3 == 0) {
                                  out->mOp = aiTextureOp_Multiply;
                                }
                                else {
                                  this_00 = DefaultLogger::get();
                                  Logger::warn(this_00,
                                               "Collada: Unsupported MAYA texture blend mode");
                                }
                              }
                            }
                            pcVar6 = "blend_mode";
                          }
                          else {
                            pcVar6 = "weighting";
                            bVar2 = IsElement(this,"weighting");
                            if (bVar2) {
                              aVar7 = ReadFloatFromTextContent(this);
                              out->mWeighting = aVar7;
                            }
                            else {
                              pcVar6 = "mix_with_previous_layer";
                              bVar2 = IsElement(this,"mix_with_previous_layer");
                              if (bVar2) {
                                aVar7 = ReadFloatFromTextContent(this);
                                out->mMixWithPrevious = aVar7;
                              }
                              else {
                                bVar2 = IsElement(this,"amount");
                                if (!bVar2) goto LAB_0041ea95;
                                aVar7 = ReadFloatFromTextContent(this);
                                out->mWeighting = aVar7;
                                pcVar6 = "amount";
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        TestClosing(this,pcVar6);
      }
      else if (iVar4 == 2) {
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar3 = strcmp((char *)CONCAT44(extraout_var_08,iVar3),"technique");
        if (iVar3 == 0) {
          return;
        }
      }
LAB_0041ea95:
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      cVar1 = (char)iVar3;
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadSamplerProperties(Sampler& out)
{
    if (mReader->isEmptyElement()) {
        return;
    }

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {

            // MAYA extensions
            // -------------------------------------------------------
            if (IsElement("wrapU")) {
                out.mWrapU = ReadBoolFromTextContent();
                TestClosing("wrapU");
            }
            else if (IsElement("wrapV")) {
                out.mWrapV = ReadBoolFromTextContent();
                TestClosing("wrapV");
            }
            else if (IsElement("mirrorU")) {
                out.mMirrorU = ReadBoolFromTextContent();
                TestClosing("mirrorU");
            }
            else if (IsElement("mirrorV")) {
                out.mMirrorV = ReadBoolFromTextContent();
                TestClosing("mirrorV");
            }
            else if (IsElement("repeatU")) {
                out.mTransform.mScaling.x = ReadFloatFromTextContent();
                TestClosing("repeatU");
            }
            else if (IsElement("repeatV")) {
                out.mTransform.mScaling.y = ReadFloatFromTextContent();
                TestClosing("repeatV");
            }
            else if (IsElement("offsetU")) {
                out.mTransform.mTranslation.x = ReadFloatFromTextContent();
                TestClosing("offsetU");
            }
            else if (IsElement("offsetV")) {
                out.mTransform.mTranslation.y = ReadFloatFromTextContent();
                TestClosing("offsetV");
            }
            else if (IsElement("rotateUV")) {
                out.mTransform.mRotation = ReadFloatFromTextContent();
                TestClosing("rotateUV");
            }
            else if (IsElement("blend_mode")) {

                const char* sz = GetTextContent();
                // http://www.feelingsoftware.com/content/view/55/72/lang,en/
                // NONE, OVER, IN, OUT, ADD, SUBTRACT, MULTIPLY, DIFFERENCE, LIGHTEN, DARKEN, SATURATE, DESATURATE and ILLUMINATE
                if (0 == ASSIMP_strincmp(sz, "ADD", 3))
                    out.mOp = aiTextureOp_Add;

                else if (0 == ASSIMP_strincmp(sz, "SUBTRACT", 8))
                    out.mOp = aiTextureOp_Subtract;

                else if (0 == ASSIMP_strincmp(sz, "MULTIPLY", 8))
                    out.mOp = aiTextureOp_Multiply;

                else {
                    ASSIMP_LOG_WARN("Collada: Unsupported MAYA texture blend mode");
                }
                TestClosing("blend_mode");
            }
            // OKINO extensions
            // -------------------------------------------------------
            else if (IsElement("weighting")) {
                out.mWeighting = ReadFloatFromTextContent();
                TestClosing("weighting");
            }
            else if (IsElement("mix_with_previous_layer")) {
                out.mMixWithPrevious = ReadFloatFromTextContent();
                TestClosing("mix_with_previous_layer");
            }
            // MAX3D extensions
            // -------------------------------------------------------
            else if (IsElement("amount")) {
                out.mWeighting = ReadFloatFromTextContent();
                TestClosing("amount");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "technique") == 0)
                break;
        }
    }
}